

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qconcatenatetablesproxymodel.cpp
# Opt level: O1

QModelIndex * __thiscall
QConcatenateTablesProxyModel::mapFromSource
          (QModelIndex *__return_storage_ptr__,QConcatenateTablesProxyModel *this,
          QModelIndex *sourceIndex)

{
  int iVar1;
  long lVar2;
  QAbstractItemModel *sourceModel;
  quintptr qVar3;
  int iVar4;
  const_iterator cVar5;
  anon_class_8_1_54a3980d_for__M_pred byModelPtr;
  
  if (((-1 < sourceIndex->r) && (-1 < sourceIndex->c)) &&
     ((sourceIndex->m).ptr != (QAbstractItemModel *)0x0)) {
    lVar2 = *(long *)(this + 8);
    sourceModel = (sourceIndex->m).ptr;
    cVar5 = std::
            __find_if<QList<QConcatenateTablesProxyModelPrivate::ModelInfo>::const_iterator,__gnu_cxx::__ops::_Iter_pred<QConcatenateTablesProxyModelPrivate::findSourceModel(QAbstractItemModel_const*)const::_lambda(auto:1_const&)_1_>>
                      (*(long *)(lVar2 + 0xe0),
                       *(long *)(lVar2 + 0xe8) * 0x90 + *(long *)(lVar2 + 0xe0),sourceModel);
    if (cVar5.i == (ModelInfo *)(*(long *)(lVar2 + 0xe8) * 0x90 + *(long *)(lVar2 + 0xe0))) {
      mapFromSource();
      return __return_storage_ptr__;
    }
    if (sourceIndex->c < *(int *)(lVar2 + 0xfc)) {
      iVar4 = QConcatenateTablesProxyModelPrivate::computeRowsPrior
                        (*(QConcatenateTablesProxyModelPrivate **)(this + 8),sourceModel);
      iVar1 = sourceIndex->c;
      qVar3 = sourceIndex->i;
      __return_storage_ptr__->r = iVar4 + sourceIndex->r;
      __return_storage_ptr__->c = iVar1;
      __return_storage_ptr__->i = qVar3;
      (__return_storage_ptr__->m).ptr = (QAbstractItemModel *)this;
      return __return_storage_ptr__;
    }
  }
  __return_storage_ptr__->r = -1;
  __return_storage_ptr__->c = -1;
  __return_storage_ptr__->i = 0;
  (__return_storage_ptr__->m).ptr = (QAbstractItemModel *)0x0;
  return __return_storage_ptr__;
}

Assistant:

QModelIndex QConcatenateTablesProxyModel::mapFromSource(const QModelIndex &sourceIndex) const
{
    Q_D(const QConcatenateTablesProxyModel);
    if (!sourceIndex.isValid())
        return QModelIndex();
    const QAbstractItemModel *sourceModel = sourceIndex.model();
    if (!d->containsSourceModel(sourceModel)) {
        qWarning("QConcatenateTablesProxyModel: index from wrong model passed to mapFromSource");
        Q_ASSERT(!"QConcatenateTablesProxyModel: index from wrong model passed to mapFromSource");
        return QModelIndex();
    }
    if (sourceIndex.column() >= d->m_columnCount)
        return QModelIndex();
    int rowsPrior = d_func()->computeRowsPrior(sourceModel);
    return createIndex(rowsPrior + sourceIndex.row(), sourceIndex.column(), sourceIndex.internalPointer());
}